

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

double __thiscall Util::RandomDouble(Util *this)

{
  result_type_conflict1 rVar1;
  
  rVar1 = std::uniform_real_distribution<double>::operator()(&this->random_double_,&this->rng_);
  return rVar1;
}

Assistant:

double Util::RandomDouble() {
    return random_double_(rng_);
}